

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_dwt_get_band_coordinates
               (opj_tcd_tilecomp_t *tilec,OPJ_UINT32 resno,OPJ_UINT32 bandno,OPJ_UINT32 tcx0,
               OPJ_UINT32 tcy0,OPJ_UINT32 tcx1,OPJ_UINT32 tcy1,OPJ_UINT32 *tbx0,OPJ_UINT32 *tby0,
               OPJ_UINT32 *tbx1,OPJ_UINT32 *tby1)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  
  iVar1 = (-(uint)(resno == 0) | -resno) + tilec->numresolutions;
  bVar2 = (byte)iVar1;
  if (tbx0 != (OPJ_UINT32 *)0x0) {
    if (iVar1 != 0) {
      uVar3 = (bandno & 1) << (bVar2 - 1 & 0x1f);
      bVar4 = uVar3 <= tcx0;
      uVar3 = tcx0 - uVar3;
      tcx0 = 0;
      if (bVar4 && uVar3 != 0) {
        tcx0 = (OPJ_UINT32)(~(-1L << (bVar2 & 0x3f)) + (ulong)uVar3 >> (bVar2 & 0x3f));
      }
    }
    *tbx0 = tcx0;
  }
  if (tby0 != (OPJ_UINT32 *)0x0) {
    if (iVar1 != 0) {
      uVar3 = (bandno >> 1) << (bVar2 - 1 & 0x1f);
      bVar4 = uVar3 <= tcy0;
      uVar3 = tcy0 - uVar3;
      tcy0 = 0;
      if (bVar4 && uVar3 != 0) {
        tcy0 = (OPJ_UINT32)(~(-1L << (bVar2 & 0x3f)) + (ulong)uVar3 >> (bVar2 & 0x3f));
      }
    }
    *tby0 = tcy0;
  }
  if (tbx1 != (OPJ_UINT32 *)0x0) {
    if (iVar1 != 0) {
      uVar3 = (bandno & 1) << (bVar2 - 1 & 0x1f);
      bVar4 = uVar3 <= tcx1;
      uVar3 = tcx1 - uVar3;
      tcx1 = 0;
      if (bVar4 && uVar3 != 0) {
        tcx1 = (OPJ_UINT32)(~(-1L << (bVar2 & 0x3f)) + (ulong)uVar3 >> (bVar2 & 0x3f));
      }
    }
    *tbx1 = tcx1;
  }
  if (tby1 != (OPJ_UINT32 *)0x0) {
    if (iVar1 != 0) {
      uVar3 = (bandno >> 1) << (bVar2 - 1 & 0x1f);
      bVar4 = uVar3 <= tcy1;
      uVar3 = tcy1 - uVar3;
      tcy1 = 0;
      if (bVar4 && uVar3 != 0) {
        tcy1 = (OPJ_UINT32)(~(-1L << (bVar2 & 0x3f)) + (ulong)uVar3 >> (bVar2 & 0x3f));
      }
    }
    *tby1 = tcy1;
  }
  return;
}

Assistant:

static void opj_dwt_get_band_coordinates(opj_tcd_tilecomp_t* tilec,
        OPJ_UINT32 resno,
        OPJ_UINT32 bandno,
        OPJ_UINT32 tcx0,
        OPJ_UINT32 tcy0,
        OPJ_UINT32 tcx1,
        OPJ_UINT32 tcy1,
        OPJ_UINT32* tbx0,
        OPJ_UINT32* tby0,
        OPJ_UINT32* tbx1,
        OPJ_UINT32* tby1)
{
    /* Compute number of decomposition for this band. See table F-1 */
    OPJ_UINT32 nb = (resno == 0) ?
                    tilec->numresolutions - 1 :
                    tilec->numresolutions - resno;
    /* Map above tile-based coordinates to sub-band-based coordinates per */
    /* equation B-15 of the standard */
    OPJ_UINT32 x0b = bandno & 1;
    OPJ_UINT32 y0b = bandno >> 1;
    if (tbx0) {
        *tbx0 = (nb == 0) ? tcx0 :
                (tcx0 <= (1U << (nb - 1)) * x0b) ? 0 :
                opj_uint_ceildivpow2(tcx0 - (1U << (nb - 1)) * x0b, nb);
    }
    if (tby0) {
        *tby0 = (nb == 0) ? tcy0 :
                (tcy0 <= (1U << (nb - 1)) * y0b) ? 0 :
                opj_uint_ceildivpow2(tcy0 - (1U << (nb - 1)) * y0b, nb);
    }
    if (tbx1) {
        *tbx1 = (nb == 0) ? tcx1 :
                (tcx1 <= (1U << (nb - 1)) * x0b) ? 0 :
                opj_uint_ceildivpow2(tcx1 - (1U << (nb - 1)) * x0b, nb);
    }
    if (tby1) {
        *tby1 = (nb == 0) ? tcy1 :
                (tcy1 <= (1U << (nb - 1)) * y0b) ? 0 :
                opj_uint_ceildivpow2(tcy1 - (1U << (nb - 1)) * y0b, nb);
    }
}